

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O0

Gia_Man_t * Gia_ManMapShrink6(Gia_Man_t *p,int nFanoutMax,int fKeepLevel,int fVerbose)

{
  Gia_Man_t *p_00;
  Rsb_Man_t *p_01;
  Vec_Int_t *p_02;
  int iVar1;
  uint uVar2;
  int iVar3;
  abctime aVar4;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  abctime aVar8;
  Gia_Man_t *pGVar9;
  bool bVar10;
  Vec_Int_t *vResult;
  abctime timeFanout;
  abctime clk;
  abctime clk2;
  uint local_68;
  int Counter2;
  int Counter1;
  int RetValue;
  int iNode;
  int nDivs;
  int k;
  int i;
  word uTruth1;
  word uTruth0;
  word uTruth;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pObj;
  Shr_Man_t *pMan;
  int local_18;
  int fVerbose_local;
  int fKeepLevel_local;
  int nFanoutMax_local;
  Gia_Man_t *p_local;
  
  local_68 = 0;
  clk2._4_4_ = 0;
  pMan._4_4_ = fVerbose;
  local_18 = fKeepLevel;
  fVerbose_local = nFanoutMax;
  _fKeepLevel_local = p;
  aVar4 = Abc_Clock();
  iVar1 = Gia_ManHasMapping(_fKeepLevel_local);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                  ,0x19a,"Gia_Man_t *Gia_ManMapShrink6(Gia_Man_t *, int, int, int)");
  }
  pObj = (Gia_Obj_t *)Shr_ManAlloc(_fKeepLevel_local);
  Gia_ManFillValue(_fKeepLevel_local);
  pGVar5 = Gia_ManConst0(_fKeepLevel_local);
  pGVar5->Value = 0;
  nDivs = 1;
  do {
    bVar10 = false;
    if (nDivs < _fKeepLevel_local->nObjs) {
      pFanin = Gia_ManObj(_fKeepLevel_local,nDivs);
      bVar10 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) {
      if (pMan._4_4_ != 0) {
        printf("Performed %d resubs and %d decomps.  ",(ulong)local_68,(ulong)clk2._4_4_);
        iVar1 = Gia_ManObjNum(_fKeepLevel_local);
        iVar3 = Gia_ManObjNum(*(Gia_Man_t **)&pObj->Value);
        printf("Gain in AIG nodes = %d.  ",(ulong)(uint)(iVar1 - iVar3));
        Abc_Print(1,"%s =","Runtime");
        aVar8 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar8 - aVar4) * 1.0) / 1000000.0);
      }
      pGVar9 = Shr_ManFree((Shr_Man_t *)pObj);
      return pGVar9;
    }
    iVar1 = Gia_ObjIsCi(pFanin);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(pFanin);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsLut(_fKeepLevel_local,nDivs);
        if (iVar1 != 0) {
          Vec_IntClear(*(Vec_Int_t **)(pObj + 6));
          for (iNode = 0; iVar1 = Gia_ObjLutSize(_fKeepLevel_local,nDivs), iNode < iVar1;
              iNode = iNode + 1) {
            piVar6 = Gia_ObjLutFanins(_fKeepLevel_local,nDivs);
            Vec_IntPush(*(Vec_Int_t **)(pObj + 6),piVar6[iNode]);
          }
          iVar1 = Vec_IntSize(*(Vec_Int_t **)(pObj + 6));
          if (6 < iVar1) {
            __assert_fail("Vec_IntSize(pMan->vLeaves) <= 6",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                          ,0x1b0,"Gia_Man_t *Gia_ManMapShrink6(Gia_Man_t *, int, int, int)");
          }
          uTruth0 = Shr_ManComputeTruth6
                              (*(Gia_Man_t **)pObj,pFanin,*(Vec_Int_t **)(pObj + 6),
                               *(Vec_Wrd_t **)&pObj[6].Value);
          if (pFanin->Value != 0xffffffff) {
            __assert_fail("pObj->Value == ~0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                          ,0x1b3,"Gia_Man_t *Gia_ManMapShrink6(Gia_Man_t *, int, int, int)");
          }
          if ((uTruth0 == 0) || (uTruth0 == 0xffffffffffffffff)) {
            uVar2 = Abc_LitNotCond(0,(uint)(uTruth0 == 0xffffffffffffffff));
            pFanin->Value = uVar2;
          }
          else {
            iNode = 0;
            while( true ) {
              iVar1 = Vec_IntSize(*(Vec_Int_t **)(pObj + 6));
              pGVar9 = _fKeepLevel_local;
              bVar10 = false;
              if (iNode < iVar1) {
                iVar1 = Vec_IntEntry(*(Vec_Int_t **)(pObj + 6),iNode);
                uTruth = (word)Gia_ManObj(pGVar9,iVar1);
                bVar10 = (Gia_Obj_t *)uTruth != (Gia_Obj_t *)0x0;
              }
              if (!bVar10) break;
              if ((uTruth0 == Truth[iNode]) || ((uTruth0 ^ 0xffffffffffffffff) == Truth[iNode])) {
                uVar2 = Abc_LitNotCond(*(int *)(uTruth + 8),
                                       (uint)((uTruth0 ^ 0xffffffffffffffff) == Truth[iNode]));
                pFanin->Value = uVar2;
              }
              iNode = iNode + 1;
            }
          }
          if (pFanin->Value == 0xffffffff) {
            iNode = 0;
            while( true ) {
              iVar1 = Vec_IntSize(*(Vec_Int_t **)(pObj + 6));
              pGVar9 = _fKeepLevel_local;
              bVar10 = false;
              if (iNode < iVar1) {
                iVar1 = Vec_IntEntry(*(Vec_Int_t **)(pObj + 6),iNode);
                uTruth = (word)Gia_ManObj(pGVar9,iVar1);
                bVar10 = (Gia_Obj_t *)uTruth != (Gia_Obj_t *)0x0;
              }
              if (!bVar10) break;
              iVar1 = Abc_LitIsCompl(*(int *)(uTruth + 8));
              if (iVar1 != 0) {
                uTruth0 = (uTruth0 & Truth[iNode]) >> ((byte)(1 << ((byte)iNode & 0x1f)) & 0x3f) |
                          (uTruth0 & (Truth[iNode] ^ 0xffffffffffffffff)) <<
                          ((byte)(1 << ((byte)iNode & 0x1f)) & 0x3f);
              }
              pVVar7 = *(Vec_Int_t **)(pObj + 6);
              iVar1 = Abc_Lit2Var(*(int *)(uTruth + 8));
              Vec_IntWriteEntry(pVVar7,iNode,iVar1);
              iNode = iNode + 1;
            }
            Abc_Clock();
            iVar1 = Shr_ManCollectDivisors
                              ((Shr_Man_t *)pObj,*(Vec_Int_t **)(pObj + 6),
                               *(int *)&pObj[1].field_0x4,fVerbose_local);
            if (*(int *)&pObj[1].field_0x4 < iVar1) {
              __assert_fail("nDivs <= pMan->nDivMax",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                            ,0x1c6,"Gia_Man_t *Gia_ManMapShrink6(Gia_Man_t *, int, int, int)");
            }
            Abc_Clock();
            pGVar9 = *(Gia_Man_t **)&pObj->Value;
            iVar1 = Vec_IntSize(*(Vec_Int_t **)(pObj + 6));
            Shr_ManComputeTruths
                      (pGVar9,iVar1,*(Vec_Int_t **)(pObj + 4),*(Vec_Wrd_t **)&pObj[7].field_0x4,
                       *(Vec_Wrd_t **)&pObj[6].Value);
            p_01 = *(Rsb_Man_t **)(pObj + 8);
            iVar1 = Vec_IntSize(*(Vec_Int_t **)(pObj + 6));
            iVar1 = Rsb_ManPerformResub6
                              (p_01,iVar1,uTruth0,*(Vec_Wrd_t **)&pObj[7].field_0x4,&uTruth1,
                               (word *)&k,0);
            if (iVar1 == 0) {
              uVar2 = Shr_ObjPerformBidec((Shr_Man_t *)pObj,*(Bdc_Man_t **)&pObj[8].Value,
                                          *(Gia_Man_t **)&pObj->Value,*(Vec_Int_t **)(pObj + 6),
                                          uTruth0,0xffffffffffffffff);
              pFanin->Value = uVar2;
              clk2._4_4_ = clk2._4_4_ + 1;
            }
            else {
              pVVar7 = Rsb_ManGetFanins(*(Rsb_Man_t **)(pObj + 8));
              Vec_IntClear(*(Vec_Int_t **)&pObj[5].field_0x4);
              for (iNode = 0; iVar1 = Vec_IntSize(pVVar7), iNode < iVar1; iNode = iNode + 1) {
                iVar1 = Vec_IntEntry(pVVar7,iNode);
                p_02 = *(Vec_Int_t **)&pObj[5].field_0x4;
                iVar1 = Vec_IntEntry(*(Vec_Int_t **)(pObj + 4),iVar1);
                Vec_IntPush(p_02,iVar1);
              }
              uVar2 = Shr_ObjPerformBidec((Shr_Man_t *)pObj,*(Bdc_Man_t **)&pObj[8].Value,
                                          *(Gia_Man_t **)&pObj->Value,
                                          *(Vec_Int_t **)&pObj[5].field_0x4,_k,uTruth1 | _k);
              pFanin->Value = uVar2;
              local_68 = local_68 + 1;
            }
          }
        }
      }
      else {
        pGVar9 = *(Gia_Man_t **)&pObj->Value;
        iVar1 = Gia_ObjFanin0Copy(pFanin);
        uVar2 = Gia_ManAppendCo(pGVar9,iVar1);
        pFanin->Value = uVar2;
      }
    }
    else {
      uVar2 = Gia_ManAppendCi(*(Gia_Man_t **)&pObj->Value);
      pFanin->Value = uVar2;
      if (_fKeepLevel_local->vLevels != (Vec_Int_t *)0x0) {
        pGVar9 = *(Gia_Man_t **)&pObj->Value;
        p_00 = *(Gia_Man_t **)&pObj->Value;
        iVar1 = Gia_ObjValue(pFanin);
        pGVar5 = Gia_ObjFromLit(p_00,iVar1);
        iVar1 = Gia_ObjLevel(_fKeepLevel_local,pFanin);
        Gia_ObjSetLevel(pGVar9,pGVar5,iVar1);
      }
    }
    nDivs = nDivs + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManMapShrink6( Gia_Man_t * p, int nFanoutMax, int fKeepLevel, int fVerbose )
{
    Shr_Man_t * pMan;
    Gia_Obj_t * pObj, * pFanin;
    word uTruth, uTruth0, uTruth1;
    int i, k, nDivs, iNode;
    int RetValue, Counter1 = 0, Counter2 = 0;
    abctime clk2, clk = Abc_Clock();
    abctime timeFanout = 0;
    assert( Gia_ManHasMapping(p) );
    pMan = Shr_ManAlloc( p );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            pObj->Value = Gia_ManAppendCi( pMan->pNew );
            if ( p->vLevels )
                Gia_ObjSetLevel( pMan->pNew, Gia_ObjFromLit(pMan->pNew, Gia_ObjValue(pObj)), Gia_ObjLevel(p, pObj) );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pObj->Value = Gia_ManAppendCo( pMan->pNew, Gia_ObjFanin0Copy(pObj) );
        }
        else if ( Gia_ObjIsLut(p, i) )
        {
            // collect leaves of this gate  
            Vec_IntClear( pMan->vLeaves );
            Gia_LutForEachFanin( p, i, iNode, k )
                Vec_IntPush( pMan->vLeaves, iNode );
            assert( Vec_IntSize(pMan->vLeaves) <= 6 );
            // compute truth table 
            uTruth = Shr_ManComputeTruth6( pMan->pGia, pObj, pMan->vLeaves, pMan->vTruths );
            assert( pObj->Value == ~0 );
            if ( uTruth == 0 || ~uTruth == 0 )
                pObj->Value = Abc_LitNotCond( 0, ~uTruth == 0 );
            else
                Gia_ManForEachObjVec( pMan->vLeaves, p, pFanin, k )
                    if ( uTruth == Truth[k] || ~uTruth == Truth[k] )
                        pObj->Value = Abc_LitNotCond( pFanin->Value, ~uTruth == Truth[k] );
            if ( pObj->Value != ~0 )
                continue;
            // translate into new nodes
            Gia_ManForEachObjVec( pMan->vLeaves, p, pFanin, k )
            {
                if ( Abc_LitIsCompl(pFanin->Value) )
                    uTruth = ((uTruth & Truth[k]) >> (1 << k)) | ((uTruth & ~Truth[k]) << (1 << k));
                Vec_IntWriteEntry( pMan->vLeaves, k, Abc_Lit2Var(pFanin->Value) );
            }
            // compute divisors
            clk2 = Abc_Clock();
            nDivs = Shr_ManCollectDivisors( pMan, pMan->vLeaves, pMan->nDivMax, nFanoutMax );
            assert( nDivs <= pMan->nDivMax );
            timeFanout += Abc_Clock() - clk2;
            // compute truth tables
            Shr_ManComputeTruths( pMan->pNew, Vec_IntSize(pMan->vLeaves), pMan->vDivs, pMan->vDivTruths, pMan->vTruths );
            // perform resubstitution
            RetValue = Rsb_ManPerformResub6( pMan->pManRsb, Vec_IntSize(pMan->vLeaves), uTruth, pMan->vDivTruths, &uTruth0, &uTruth1, 0 );
            if ( RetValue ) // resub exists
            {
                Vec_Int_t * vResult = Rsb_ManGetFanins(pMan->pManRsb);
                Vec_IntClear( pMan->vDivResub );
                Vec_IntForEachEntry( vResult, iNode, k )
                    Vec_IntPush( pMan->vDivResub, Vec_IntEntry(pMan->vDivs, iNode) );
                pObj->Value = Shr_ObjPerformBidec( pMan, pMan->pManDec, pMan->pNew, pMan->vDivResub, uTruth1, uTruth0 | uTruth1 );
                Counter1++;
            }
            else
            {
                pObj->Value = Shr_ObjPerformBidec( pMan, pMan->pManDec, pMan->pNew, pMan->vLeaves, uTruth, ~(word)0 );
                Counter2++;
            }
        }
    }
    if ( fVerbose )
    {
        printf( "Performed %d resubs and %d decomps.  ", Counter1, Counter2 );
        printf( "Gain in AIG nodes = %d.  ", Gia_ManObjNum(p)-Gia_ManObjNum(pMan->pNew) );
        ABC_PRT( "Runtime", Abc_Clock() - clk );
//        ABC_PRT( "Divisors", timeFanout );        
    }
    return Shr_ManFree( pMan );
}